

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O1

void __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::reportSubtree(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *this,Node *node,vector<int_*,_std::allocator<int_*>_> *result)

{
  pointer *pppiVar1;
  iterator __position;
  
  for (; node->left != (Node *)0x0; node = node->right) {
    reportSubtree(this,node->left,result);
  }
  __position._M_current =
       (result->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current !=
      (result->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    *__position._M_current = node->value;
    pppiVar1 = &(result->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppiVar1 = *pppiVar1 + 1;
    return;
  }
  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
            ((vector<int*,std::allocator<int*>> *)result,__position,&node->value);
  return;
}

Assistant:

void reportSubtree(const Node * const node, std::vector<T*> * const result) const {
			if (node->left != 0) {
				reportSubtree(node->left, result);
				reportSubtree(node->right, result);
			}
			else {
				result->push_back(node->value);
			}
		}